

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::StartXML(cmCTest *this,cmXMLWriter *xml,bool append)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *__rhs;
  float fVar5;
  allocator<char> local_221;
  SystemInformation info;
  string changeId;
  string local_1f8;
  string site;
  string stamp;
  string buildname;
  
  if ((this->CurrentTag)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buildname);
    poVar4 = std::operator<<((ostream *)&buildname,
                             "Current Tag empty, this may mean NightlStartTime was not set correctly."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x539,stamp._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&stamp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildname);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  cmsys::SystemInformation::SystemInformation(&info);
  cmsys::SystemInformation::RunCPUCheck(&info);
  cmsys::SystemInformation::RunOSCheck(&info);
  cmsys::SystemInformation::RunMemoryCheck(&info);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&site,"BuildName",(allocator<char> *)&changeId);
  GetCTestConfiguration(&stamp,this,&site);
  SafeBuildIdField(&buildname,&stamp);
  std::__cxx11::string::~string((string *)&stamp);
  std::__cxx11::string::~string((string *)&site);
  std::operator+(&changeId,&this->CurrentTag,"-");
  GetTestModelString_abi_cxx11_(&local_1f8,this);
  std::operator+(&site,&changeId,&local_1f8);
  SafeBuildIdField(&stamp,&site);
  std::__cxx11::string::~string((string *)&site);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Site",&local_221);
  GetCTestConfiguration(&changeId,this,&local_1f8);
  SafeBuildIdField(&site,&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::~string((string *)&local_1f8);
  cmXMLWriter::StartDocument(xml,"UTF-8");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&changeId,"Site",(allocator<char> *)&local_1f8);
  cmXMLWriter::StartElement(xml,&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",&buildname);
  cmXMLWriter::BreakAttributes(xml);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildStamp",&stamp);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&site);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"ctest-",&local_221);
  __rhs = cmVersion::GetCMakeVersion();
  std::operator+(&changeId,&local_1f8,__rhs);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (append) {
    cmXMLWriter::Attribute<char[5]>(xml,"Append",(char (*) [5])0x4b4546);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Compiler",&local_221);
  GetCTestConfiguration(&changeId,this,&local_1f8);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerName",&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CompilerVersion",&local_221);
  GetCTestConfiguration(&changeId,this,&local_1f8);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerVersion",&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::~string((string *)&local_1f8);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetOSName(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"OSName",(char **)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetHostname(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"Hostname",(char **)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetOSRelease(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"OSRelease",(char **)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetOSVersion(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"OSVersion",(char **)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetOSPlatform(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"OSPlatform",(char **)&changeId);
  bVar1 = cmsys::SystemInformation::Is64Bits(&info);
  changeId._M_dataplus._M_p._0_1_ = bVar1;
  cmXMLWriter::Attribute<bool>(xml,"Is64Bits",(bool *)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetVendorString(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"VendorString",(char **)&changeId);
  changeId._M_dataplus._M_p = cmsys::SystemInformation::GetVendorID(&info);
  cmXMLWriter::Attribute<char_const*>(xml,"VendorID",(char **)&changeId);
  cmsys::SystemInformation::GetFamilyID_abi_cxx11_(&changeId,&info);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"FamilyID",&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  cmsys::SystemInformation::GetModelID_abi_cxx11_(&changeId,&info);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"ModelID",&changeId);
  std::__cxx11::string::~string((string *)&changeId);
  iVar2 = cmsys::SystemInformation::GetProcessorCacheSize(&info);
  changeId._M_dataplus._M_p._0_4_ = (float)iVar2;
  cmXMLWriter::Attribute<int>(xml,"ProcessorCacheSize",(int *)&changeId);
  uVar3 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&info);
  changeId._M_dataplus._M_p._0_4_ = (float)uVar3;
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfLogicalCPU",(uint *)&changeId);
  uVar3 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&info);
  changeId._M_dataplus._M_p._0_4_ = (float)uVar3;
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfPhysicalCPU",(uint *)&changeId);
  changeId._M_dataplus._M_p = (pointer)cmsys::SystemInformation::GetTotalVirtualMemory(&info);
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalVirtualMemory",(unsigned_long *)&changeId);
  changeId._M_dataplus._M_p = (pointer)cmsys::SystemInformation::GetTotalPhysicalMemory(&info);
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalPhysicalMemory",(unsigned_long *)&changeId);
  uVar3 = cmsys::SystemInformation::GetLogicalProcessorsPerPhysical(&info);
  changeId._M_dataplus._M_p._0_4_ = (float)uVar3;
  cmXMLWriter::Attribute<unsigned_int>(xml,"LogicalProcessorsPerPhysical",(uint *)&changeId);
  fVar5 = cmsys::SystemInformation::GetProcessorClockFrequency(&info);
  changeId._M_dataplus._M_p._0_4_ = fVar5;
  cmXMLWriter::Attribute<float>(xml,"ProcessorClockFrequency",(float *)&changeId);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"ChangeId",&local_221);
  GetCTestConfiguration(&changeId,this,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (changeId._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"ChangeId",&changeId);
  }
  AddSiteProperties(this,xml);
  std::__cxx11::string::~string((string *)&changeId);
  std::__cxx11::string::~string((string *)&site);
  std::__cxx11::string::~string((string *)&stamp);
  std::__cxx11::string::~string((string *)&buildname);
  cmsys::SystemInformation::~SystemInformation(&info);
  return;
}

Assistant:

void cmCTest::StartXML(cmXMLWriter& xml, bool append)
{
  if (this->CurrentTag.empty()) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Current Tag empty, this may mean"
               " NightlStartTime was not set correctly."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccured();
  }

  // find out about the system
  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  std::string stamp = cmCTest::SafeBuildIdField(this->CurrentTag + "-" +
                                                this->GetTestModelString());
  std::string site =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("Site"));

  xml.StartDocument();
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.BreakAttributes();
  xml.Attribute("BuildStamp", stamp);
  xml.Attribute("Name", site);
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  if (append) {
    xml.Attribute("Append", "true");
  }
  xml.Attribute("CompilerName", this->GetCTestConfiguration("Compiler"));
  xml.Attribute("CompilerVersion",
                this->GetCTestConfiguration("CompilerVersion"));
  xml.Attribute("OSName", info.GetOSName());
  xml.Attribute("Hostname", info.GetHostname());
  xml.Attribute("OSRelease", info.GetOSRelease());
  xml.Attribute("OSVersion", info.GetOSVersion());
  xml.Attribute("OSPlatform", info.GetOSPlatform());
  xml.Attribute("Is64Bits", info.Is64Bits());
  xml.Attribute("VendorString", info.GetVendorString());
  xml.Attribute("VendorID", info.GetVendorID());
  xml.Attribute("FamilyID", info.GetFamilyID());
  xml.Attribute("ModelID", info.GetModelID());
  xml.Attribute("ProcessorCacheSize", info.GetProcessorCacheSize());
  xml.Attribute("NumberOfLogicalCPU", info.GetNumberOfLogicalCPU());
  xml.Attribute("NumberOfPhysicalCPU", info.GetNumberOfPhysicalCPU());
  xml.Attribute("TotalVirtualMemory", info.GetTotalVirtualMemory());
  xml.Attribute("TotalPhysicalMemory", info.GetTotalPhysicalMemory());
  xml.Attribute("LogicalProcessorsPerPhysical",
                info.GetLogicalProcessorsPerPhysical());
  xml.Attribute("ProcessorClockFrequency", info.GetProcessorClockFrequency());

  std::string changeId = this->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Attribute("ChangeId", changeId);
  }

  this->AddSiteProperties(xml);
}